

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_text(format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *this,char *begin,char *end)

{
  type __n;
  iterator it_00;
  char *pcVar1;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  type *it;
  iterator out;
  type size;
  size_t in_stack_ffffffffffffffc8;
  back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *in_stack_ffffffffffffffd0;
  undefined8 *puVar2;
  
  __n = internal::to_unsigned<long>((long)in_RDX - in_RSI);
  it_00 = internal::
          context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
          ::out((context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                 *)(in_RDI + 8));
  internal::reserve<fmt::v5::internal::basic_buffer<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  puVar2 = (undefined8 *)&stack0xffffffffffffffc8;
  pcVar1 = std::copy_n<char_const*,unsigned_long,char*>(in_RDX,__n,(char *)it_00.container);
  *puVar2 = pcVar1;
  internal::
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ::advance_to((context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                *)(in_RDI + 8),it_00);
  return;
}

Assistant:

void on_text(const Char *begin, const Char *end) {
    auto size = internal::to_unsigned(end - begin);
    auto out = context.out();
    auto &&it = internal::reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }